

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_gcd_into(mp_int *a,mp_int *b,mp_int *gcd,mp_int *A,mp_int *B)

{
  mp_int *pmVar1;
  size_t sVar2;
  mp_int *b_in;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  BignumInt BVar7;
  ulong uVar8;
  
  uVar3 = b->nw;
  if (b->nw < a->nw) {
    uVar3 = a->nw;
  }
  pmVar1 = mp_make_sized(uVar3);
  sVar2 = pmVar1->nw;
  for (uVar3 = 0; sVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < a->nw) {
      uVar5 = a->w[uVar3];
    }
    else {
      uVar5 = 0;
    }
    if (uVar3 < b->nw) {
      BVar7 = b->w[uVar3];
    }
    else {
      BVar7 = 0;
    }
    pmVar1->w[uVar3] = BVar7 | uVar5;
  }
  uVar3 = 1;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    uVar5 = pmVar1->w[sVar4];
    uVar8 = ~uVar5;
    uVar6 = uVar3 + uVar8;
    uVar3 = (ulong)CARRY8(uVar3,uVar8);
    pmVar1->w[sVar4] = uVar6 & uVar5;
  }
  sVar2 = mp_get_nbits(pmVar1);
  sVar2 = sVar2 - 1;
  mp_free(pmVar1);
  pmVar1 = mp_rshift_safe(a,sVar2);
  b_in = mp_rshift_safe(b,sVar2);
  mp_bezout_into(A,B,gcd,pmVar1,b_in);
  mp_free(pmVar1);
  mp_free(b_in);
  if (gcd != (mp_int *)0x0) {
    mp_lshift_safe_in_place(gcd,sVar2);
    return;
  }
  return;
}

Assistant:

void mp_gcd_into(mp_int *a, mp_int *b, mp_int *gcd, mp_int *A, mp_int *B)
{
    /*
     * Identify shared factors of 2. To do this we OR the two numbers
     * to get something whose lowest set bit is in the right place,
     * remove all higher bits by ANDing it with its own negation, and
     * use mp_get_nbits to find the location of the single remaining
     * set bit.
     */
    mp_int *tmp = mp_make_sized(size_t_max(a->nw, b->nw));
    for (size_t i = 0; i < tmp->nw; i++)
        tmp->w[i] = mp_word(a, i) | mp_word(b, i);
    BignumCarry carry = 1;
    for (size_t i = 0; i < tmp->nw; i++) {
        BignumInt negw;
        BignumADC(negw, carry, 0, ~tmp->w[i], carry);
        tmp->w[i] &= negw;
    }
    size_t shift = mp_get_nbits(tmp) - 1;
    mp_free(tmp);

    /*
     * Make copies of a,b with those shared factors of 2 divided off,
     * so that at least one is odd (which is the precondition for
     * mp_bezout_into). Compute the gcd of those.
     */
    mp_int *as = mp_rshift_safe(a, shift);
    mp_int *bs = mp_rshift_safe(b, shift);
    mp_bezout_into(A, B, gcd, as, bs);
    mp_free(as);
    mp_free(bs);

    /*
     * And finally shift the gcd back up (unless the caller didn't
     * even ask for it), to put the shared factors of 2 back in.
     */
    if (gcd)
        mp_lshift_safe_in_place(gcd, shift);
}